

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O3

void __thiscall
tcu::anon_unknown_0::decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1
          (anon_unknown_0 *this,PixelBufferAccess *dst,deUint8 *src)

{
  int i;
  int iVar1;
  long lVar2;
  byte *pbVar3;
  ulong src_00;
  long lVar4;
  byte *pbVar5;
  int x;
  long lVar6;
  deUint8 *pdVar7;
  deUint8 uncompressedBlockAlpha [16];
  deUint8 uncompressedBlockRGB [48];
  deUint8 local_58 [16];
  deUint8 local_48 [2];
  byte local_46 [46];
  
  pdVar7 = local_58;
  lVar2 = 0;
  src_00 = 0;
  do {
    src_00 = (ulong)src[lVar2] | src_00 << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  EtcDecompressInternal::decompressETC2Block(local_48,src_00,local_58,true);
  iVar1 = 0;
  pbVar3 = local_46;
  lVar2 = 0;
  do {
    lVar4 = (long)iVar1;
    lVar6 = 0;
    pbVar5 = pbVar3;
    do {
      *(byte *)((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar6 * 4 + lVar4 + -8) =
           pbVar5[-2];
      *(byte *)((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar6 * 4 + lVar4 + -7) =
           pbVar5[-1];
      *(byte *)((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar6 * 4 + lVar4 + -6) =
           *pbVar5;
      *(deUint8 *)((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar6 * 4 + lVar4 + -5)
           = pdVar7[lVar6];
      lVar6 = lVar6 + 1;
      pbVar5 = pbVar5 + 3;
    } while (lVar6 != 4);
    lVar2 = lVar2 + 1;
    iVar1 = iVar1 + (int)this;
    pbVar3 = pbVar3 + 0xc;
    pdVar7 = pdVar7 + 4;
  } while (lVar2 != 4);
  return;
}

Assistant:

void decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1 (const PixelBufferAccess& dst, const deUint8* src)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8;

	const deUint64	compressedBlockRGBA	= get64BitBlock(src, 0);
	deUint8			uncompressedBlockRGB[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8];
	deUint8			uncompressedBlockAlpha[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8];

	// Decompress.
	decompressETC2Block(uncompressedBlockRGB, compressedBlockRGBA, uncompressedBlockAlpha, DE_TRUE);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			const deUint8* const	srcPixel		= &uncompressedBlockRGB[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8];
			const deUint8* const	srcPixelAlpha	= &uncompressedBlockAlpha[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8];
			deUint8* const			dstPixel		= dstPtr + y*dstRowPitch + x*dstPixelSize;

			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8 == 4);
			dstPixel[0] = srcPixel[0];
			dstPixel[1] = srcPixel[1];
			dstPixel[2] = srcPixel[2];
			dstPixel[3] = srcPixelAlpha[0];
		}
	}
}